

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

string * get_description_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *node)

{
  uint __val;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  undefined7 extraout_var;
  long *plVar4;
  string *psVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  string __str;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Name/Number tree node","");
  bVar2 = QPDFObjectHandle::isIndirect(node);
  psVar5 = (string *)CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    uVar3 = QPDFObjectHandle::getObjectID(node);
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_0013036e;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_0013036e;
        }
        if (uVar6 < 10000) goto LAB_0013036e;
        uVar8 = uVar8 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_0013036e:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_50[0]),__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x25f82c);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_80 = *plVar7;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar5 = (string *)
             std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
      psVar5 = extraout_RAX;
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
      psVar5 = extraout_RAX_00;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
      psVar5 = extraout_RAX_01;
    }
  }
  return psVar5;
}

Assistant:

static std::string
get_description(QPDFObjectHandle& node)
{
    std::string result("Name/Number tree node");
    if (node.isIndirect()) {
        result += " (object " + std::to_string(node.getObjectID()) + ")";
    }
    return result;
}